

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

Layer * ncnn::Convolution_layer_creator(void)

{
  Layer *this;
  
  this = (Layer *)operator_new(0x240);
  Layer::Layer(this);
  this->_vptr_Layer = (_func_int **)&PTR__Convolution_00199ab8;
  this[1].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[1].name.field_2 + 8) = 0;
  *(undefined8 *)((long)&this[1].name.field_2 + 0xc) = 0;
  *(undefined8 *)
   ((long)&this[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  this[3].type.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[3].type.field_2 + 8) = 0;
  this[3].name._M_dataplus._M_p = (pointer)0x0;
  this[3].name._M_string_length = 0;
  this[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[2]._vptr_Layer = (_func_int **)0x0;
  this[2].one_blob_only = false;
  this[2].support_inplace = false;
  this[2].support_vulkan = false;
  this[2].support_packing = false;
  this[2].typeindex = 0;
  *(undefined8 *)&this[2].typeindex = 0;
  *(undefined8 *)((long)&this[2].type._M_dataplus._M_p + 4) = 0;
  this[2].type.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[2].type.field_2 + 8) = 0;
  this[2].name._M_dataplus._M_p = (pointer)0x0;
  this[2].name._M_string_length = 0;
  this[2].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[2].name.field_2 + 8) = 0;
  *(undefined8 *)((long)&this[2].name.field_2 + 0xc) = 0;
  *(undefined8 *)
   ((long)&this[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  this[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[3]._vptr_Layer = (_func_int **)0x0;
  this[3].one_blob_only = false;
  this[3].support_inplace = false;
  this[3].support_vulkan = false;
  this[3].support_packing = false;
  this[3].typeindex = 0;
  *(undefined8 *)&this[3].typeindex = 0;
  *(undefined8 *)((long)&this[3].type._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&this[4].type.field_2 + 8) = 0;
  this[4].name._M_dataplus._M_p = (pointer)0x0;
  this[4].type._M_string_length = 0;
  this[4].type.field_2._M_allocated_capacity = 0;
  this[4].one_blob_only = false;
  this[4].support_inplace = false;
  this[4].support_vulkan = false;
  this[4].support_packing = false;
  this[4].typeindex = 0;
  this[4].type._M_dataplus._M_p = (pointer)0x0;
  this[3].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[4]._vptr_Layer = (_func_int **)0x0;
  this[3].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[3].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[3].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[3].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->one_blob_only = true;
  this->support_inplace = false;
  this[3].name.field_2._M_local_buf[9] = '\0';
  this[3].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  return this;
}

Assistant:

Convolution::Convolution()
{
    one_blob_only = true;
    support_inplace = false;
    use_int8_requantize = false;

    quantize = 0;
}